

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O1

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::call_match
          (Dynamic_Object_Function *this,Function_Params *vals,Type_Conversions_State *t_conversions
          )

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  
  if ((vals->m_begin != vals->m_end) &&
     (bVar2 = dynamic_object_typename_match
                        (this,vals->m_begin,&this->m_type_name,&this->m_ti,t_conversions), bVar2)) {
    peVar1 = (this->m_func).
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar3 = (*peVar1->_vptr_Proxy_Function_Base[3])(peVar1,vals,t_conversions);
    return (bool)(char)iVar3;
  }
  return false;
}

Assistant:

bool call_match(const chaiscript::Function_Params &vals, const Type_Conversions_State &t_conversions) const noexcept override {
          if (dynamic_object_typename_match(vals, m_type_name, m_ti, t_conversions)) {
            return m_func->call_match(vals, t_conversions);
          } else {
            return false;
          }
        }